

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::Client::write_request(Client *this,Stream *strm,Request *req)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  unsigned_long __val;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 local_c0 [8];
  string str;
  undefined1 local_80 [8];
  string length;
  char *local_50;
  char *local_48;
  undefined1 local_40 [8];
  string path;
  Request *req_local;
  Stream *strm_local;
  Client *this_local;
  
  path.field_2._8_8_ = req;
  detail::encode_url((string *)local_40,&req->path);
  local_48 = (char *)std::__cxx11::string::c_str();
  local_50 = (char *)std::__cxx11::string::c_str();
  Stream::write_format<char_const*,char_const*>(strm,"%s %s HTTP/1.1\r\n",&local_48,&local_50);
  uVar4 = path.field_2._8_8_;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  Request::set_header((Request *)uVar4,"Host",pcVar2);
  bVar1 = Request::has_header((Request *)path.field_2._8_8_,"Accept");
  if (!bVar1) {
    Request::set_header((Request *)path.field_2._8_8_,"Accept","*/*");
  }
  bVar1 = Request::has_header((Request *)path.field_2._8_8_,"User-Agent");
  if (!bVar1) {
    Request::set_header((Request *)path.field_2._8_8_,"User-Agent","cpp-httplib/0.2");
  }
  Request::set_header((Request *)path.field_2._8_8_,"Connection","close");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = Request::has_header((Request *)path.field_2._8_8_,"Content-Type");
    if (!bVar1) {
      Request::set_header((Request *)path.field_2._8_8_,"Content-Type","text/plain");
    }
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string((string *)local_80,__val);
    uVar4 = path.field_2._8_8_;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Request::set_header((Request *)uVar4,"Content-Length",pcVar2);
    std::__cxx11::string::~string((string *)local_80);
  }
  detail::write_headers<httplib::Request>(strm,(Request *)path.field_2._8_8_);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    Request::get_header_value_abi_cxx11_
              ((string *)((long)&str.field_2 + 8),(Request *)path.field_2._8_8_,"Content-Type");
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&str.field_2 + 8),"application/x-www-form-urlencoded");
    std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
    if (bVar1) {
      detail::encode_url((string *)local_c0,(string *)(path.field_2._8_8_ + 0x90));
      uVar4 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::size();
      (*strm->_vptr_Stream[3])(strm,uVar4,uVar5);
      std::__cxx11::string::~string((string *)local_c0);
    }
    else {
      uVar4 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::size();
      (*strm->_vptr_Stream[3])(strm,uVar4,uVar5);
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

inline void Client::write_request(Stream& strm, Request& req)
{
    auto path = detail::encode_url(req.path);

    // Request line
    strm.write_format("%s %s HTTP/1.1\r\n",
        req.method.c_str(),
        path.c_str());

    // Headers
    req.set_header("Host", host_and_port_.c_str());

    if (!req.has_header("Accept")) {
        req.set_header("Accept", "*/*");
    }

    if (!req.has_header("User-Agent")) {
        req.set_header("User-Agent", "cpp-httplib/0.2");
    }

    // TODO: Support KeepAlive connection
    // if (!req.has_header("Connection")) {
        req.set_header("Connection", "close");
    // }

    if (!req.body.empty()) {
        if (!req.has_header("Content-Type")) {
            req.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(req.body.size());
        req.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, req);

    // Body
    if (!req.body.empty()) {
        if (req.get_header_value("Content-Type") == "application/x-www-form-urlencoded") {
            auto str = detail::encode_url(req.body);
            strm.write(str.c_str(), str.size());
        } else {
            strm.write(req.body.c_str(), req.body.size());
        }
    }
}